

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O0

void __thiscall cmComputeComponentGraph::Tarjan(cmComputeComponentGraph *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  int local_28;
  value_type_conflict2 local_24;
  int i;
  value_type local_1c;
  TarjanEntry entry;
  int n;
  cmComputeComponentGraph *this_local;
  
  unique0x100001a6 = this;
  sVar2 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                    (&this->InputGraph->
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  entry.Root = (int)sVar2;
  memset(&local_1c,0,8);
  std::
  vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::resize(&this->TarjanEntries,0);
  std::
  vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::resize(&this->TarjanEntries,(long)entry.Root,&local_1c);
  std::vector<int,_std::allocator<int>_>::resize(&this->TarjanComponents,0);
  i = -1;
  std::vector<int,_std::allocator<int>_>::resize(&this->TarjanComponents,(long)entry.Root,&i);
  this->TarjanWalkId = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->TarjanVisited,0);
  local_24 = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->TarjanVisited,(long)entry.Root,&local_24);
  local_28 = 0;
  do {
    if (entry.Root <= local_28) {
      return;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->TarjanVisited,(long)local_28)
    ;
    if (*pvVar3 == 0) {
      bVar1 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty(&this->TarjanStack);
      if (!bVar1) {
        __assert_fail("this->TarjanStack.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmComputeComponentGraph.cxx"
                      ,0x28,"void cmComputeComponentGraph::Tarjan()");
      }
      this->TarjanWalkId = this->TarjanWalkId + 1;
      this->TarjanIndex = 0;
      TarjanVisit(this,local_28);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void cmComputeComponentGraph::Tarjan()
{
  int n = static_cast<int>(this->InputGraph.size());
  TarjanEntry entry = { 0, 0 };
  this->TarjanEntries.resize(0);
  this->TarjanEntries.resize(n, entry);
  this->TarjanComponents.resize(0);
  this->TarjanComponents.resize(n, -1);
  this->TarjanWalkId = 0;
  this->TarjanVisited.resize(0);
  this->TarjanVisited.resize(n, 0);
  for (int i = 0; i < n; ++i) {
    // Start a new DFS from this node if it has never been visited.
    if (!this->TarjanVisited[i]) {
      assert(this->TarjanStack.empty());
      ++this->TarjanWalkId;
      this->TarjanIndex = 0;
      this->TarjanVisit(i);
    }
  }
}